

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O1

void __thiscall Assimp::LWO::Shader::Shader(Shader *this)

{
  (this->ordinal)._M_dataplus._M_p = (pointer)&(this->ordinal).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"");
  (this->functionName)._M_dataplus._M_p = (pointer)&(this->functionName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->functionName,"unknown","");
  this->enabled = true;
  return;
}

Assistant:

Shader()
        :   ordinal         ("\x00")
        ,   functionName    ("unknown")
        ,   enabled         (true)
    {}